

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_test.cpp
# Opt level: O2

int __thiscall ot::commissioner::MockSocket::Receive(MockSocket *this,ByteArray *aBuf)

{
  uint uVar1;
  uint uVar2;
  uint8_t buf [512];
  uchar auStack_218 [512];
  
  while( true ) {
    uVar1 = (*(this->super_Socket)._vptr_Socket[7])(this,auStack_218,0x200);
    if ((int)uVar1 < 1) break;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)aBuf,
               (const_iterator)
               (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,auStack_218,auStack_218 + uVar1);
  }
  uVar2 = 0;
  if ((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar2 = 0xffff9700;
  }
  if (uVar1 != 0xffff9700) {
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

int MockSocket::Receive(ByteArray &aBuf)
{
    uint8_t buf[512];
    int     rval;

    while ((rval = Receive(buf, sizeof(buf))) > 0)
    {
        aBuf.insert(aBuf.end(), buf, buf + rval);
    }

    VerifyOrExit(rval != MBEDTLS_ERR_SSL_WANT_READ || aBuf.empty(), rval = 0);

exit:
    return rval;
}